

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ZSTD_compressionParameters *cParams_00;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  seqDef *psVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  U32 UVar15;
  ulong *puVar16;
  size_t sVar17;
  BYTE *pBVar18;
  ulong uVar19;
  BYTE *pBVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong *puVar24;
  BYTE *pBVar25;
  U32 UVar26;
  BYTE *pBVar27;
  ulong *puVar28;
  uint uVar29;
  ulong *puVar30;
  ulong *puVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  ZSTD_compressionParameters *cParams;
  ulong local_158;
  U32 local_144;
  ulong local_140;
  BYTE *local_130;
  BYTE *local_e0;
  ulong *local_d0;
  ulong *local_c0;
  int local_94;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar8 = (ms->window).base;
  pBVar9 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar8 + uVar5;
  local_144 = *rep;
  UVar26 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  puVar28 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  local_d0 = (ulong *)src;
  if (puVar28 < puVar4) {
    puVar16 = (ulong *)(pBVar9 + uVar5);
    iVar13 = uVar5 - 1;
    cParams_00 = &ms->cParams;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    do {
      iVar33 = (int)puVar28;
      local_94 = iVar33 - (int)pBVar8;
      uVar14 = (local_94 - local_144) + 1;
      pBVar25 = pBVar8;
      if (uVar14 < uVar5) {
        pBVar25 = pBVar9;
      }
      if ((uVar6 < uVar14 && 2 < iVar13 - uVar14) &&
         (*(int *)((long)puVar28 + 1) == *(int *)(pBVar25 + uVar14))) {
        puVar30 = iEnd;
        if (uVar14 < uVar5) {
          puVar30 = puVar16;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar28 + 5),(BYTE *)((long)(pBVar25 + uVar14) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar30,iStart);
        local_e0 = (BYTE *)(sVar17 + 4);
      }
      else {
        local_e0 = (BYTE *)0x0;
      }
      uVar14 = (ms->cParams).minMatch;
      if (uVar14 - 6 < 2) {
        uVar34 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar10 = ms->chainTable;
        pBVar25 = (ms->window).base;
        pBVar20 = (ms->window).dictBase;
        uVar14 = (ms->window).dictLimit;
        uVar23 = (ms->window).lowLimit;
        uVar29 = iVar33 - (int)pBVar25;
        uVar22 = uVar29 - uVar34;
        if (uVar29 < uVar34) {
          uVar22 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar28,6);
        if (UVar15 <= uVar23) goto LAB_00466d31;
        iVar33 = 1 << ((byte)uVar7 & 0x1f);
        local_140 = 999999999;
        pBVar27 = (BYTE *)0x3;
        do {
          if (UVar15 < uVar14) {
            if (*(int *)(pBVar20 + UVar15) == (int)*puVar28) {
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar28 + 4),pBVar20 + (ulong)UVar15 + 4,
                                  (BYTE *)iEnd,pBVar20 + uVar14,pBVar25 + uVar14);
              pBVar18 = (BYTE *)(sVar17 + 4);
            }
            else {
LAB_004667de:
              pBVar18 = (BYTE *)0x0;
            }
          }
          else {
            puVar30 = (ulong *)(pBVar25 + UVar15);
            if (pBVar27[(long)puVar30] != *(BYTE *)((long)puVar28 + (long)pBVar27))
            goto LAB_004667de;
            puVar31 = puVar28;
            if (puVar28 < puVar1) {
              uVar19 = *puVar28 ^ *puVar30;
              uVar21 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              pBVar18 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
              if (*puVar30 == *puVar28) {
                do {
                  puVar31 = puVar31 + 1;
                  puVar30 = puVar30 + 1;
                  if (puVar1 <= puVar31) goto LAB_004667e5;
                  uVar19 = *puVar31 ^ *puVar30;
                  uVar21 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  pBVar18 = (BYTE *)((long)puVar31 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar28));
                } while (*puVar30 == *puVar31);
              }
            }
            else {
LAB_004667e5:
              if ((puVar31 < puVar2) && ((int)*puVar30 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar31 < puVar3) && ((short)*puVar30 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar31 < iEnd) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar31));
              }
              pBVar18 = (BYTE *)((long)puVar31 - (long)puVar28);
            }
          }
          if ((pBVar27 < pBVar18) &&
             (local_140 = (ulong)((uVar29 + 2) - UVar15), pBVar27 = pBVar18,
             (ulong *)((long)puVar28 + (long)pBVar18) == iEnd)) {
            bVar12 = false;
          }
          else {
            pBVar18 = pBVar27;
            if (uVar22 < UVar15) {
              UVar15 = pUVar10[UVar15 & uVar34 - 1];
              bVar12 = true;
            }
            else {
              bVar12 = false;
            }
          }
        } while (((bVar12) && (uVar23 < UVar15)) &&
                (iVar33 = iVar33 + -1, pBVar27 = pBVar18, iVar33 != 0));
      }
      else if (uVar14 == 5) {
        uVar34 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar10 = ms->chainTable;
        pBVar25 = (ms->window).base;
        pBVar20 = (ms->window).dictBase;
        uVar14 = (ms->window).dictLimit;
        uVar23 = (ms->window).lowLimit;
        uVar29 = iVar33 - (int)pBVar25;
        uVar22 = uVar29 - uVar34;
        if (uVar29 < uVar34) {
          uVar22 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar28,5);
        if (uVar23 < UVar15) {
          iVar33 = 1 << ((byte)uVar7 & 0x1f);
          local_140 = 999999999;
          pBVar27 = (BYTE *)0x3;
          do {
            if (UVar15 < uVar14) {
              if (*(int *)(pBVar20 + UVar15) == (int)*puVar28) {
                sVar17 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar28 + 4),pBVar20 + (ulong)UVar15 + 4,
                                    (BYTE *)iEnd,pBVar20 + uVar14,pBVar25 + uVar14);
                pBVar18 = (BYTE *)(sVar17 + 4);
              }
              else {
LAB_00466a39:
                pBVar18 = (BYTE *)0x0;
              }
            }
            else {
              puVar30 = (ulong *)(pBVar25 + UVar15);
              if (pBVar27[(long)puVar30] != *(BYTE *)((long)puVar28 + (long)pBVar27))
              goto LAB_00466a39;
              puVar31 = puVar28;
              if (puVar28 < puVar1) {
                uVar19 = *puVar28 ^ *puVar30;
                uVar21 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                pBVar18 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                if (*puVar30 == *puVar28) {
                  do {
                    puVar31 = puVar31 + 1;
                    puVar30 = puVar30 + 1;
                    if (puVar1 <= puVar31) goto LAB_00466a40;
                    uVar19 = *puVar31 ^ *puVar30;
                    uVar21 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar18 = (BYTE *)((long)puVar31 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar28))
                    ;
                  } while (*puVar30 == *puVar31);
                }
              }
              else {
LAB_00466a40:
                if ((puVar31 < puVar2) && ((int)*puVar30 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar30 = (ulong *)((long)puVar30 + 4);
                }
                if ((puVar31 < puVar3) && ((short)*puVar30 == (short)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar30 = (ulong *)((long)puVar30 + 2);
                }
                if (puVar31 < iEnd) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar31));
                }
                pBVar18 = (BYTE *)((long)puVar31 - (long)puVar28);
              }
            }
            if ((pBVar27 < pBVar18) &&
               (local_140 = (ulong)((uVar29 + 2) - UVar15), pBVar27 = pBVar18,
               (ulong *)((long)puVar28 + (long)pBVar18) == iEnd)) {
              bVar12 = false;
            }
            else {
              pBVar18 = pBVar27;
              if (uVar22 < UVar15) {
                UVar15 = pUVar10[UVar15 & uVar34 - 1];
                bVar12 = true;
              }
              else {
                bVar12 = false;
              }
            }
          } while (((bVar12) && (uVar23 < UVar15)) &&
                  (iVar33 = iVar33 + -1, pBVar27 = pBVar18, iVar33 != 0));
        }
        else {
LAB_00466d31:
          pBVar18 = (BYTE *)0x3;
          local_140 = 999999999;
        }
      }
      else {
        uVar34 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar10 = ms->chainTable;
        pBVar25 = (ms->window).base;
        pBVar20 = (ms->window).dictBase;
        uVar14 = (ms->window).dictLimit;
        uVar23 = (ms->window).lowLimit;
        uVar29 = iVar33 - (int)pBVar25;
        uVar22 = uVar29 - uVar34;
        if (uVar29 < uVar34) {
          uVar22 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar28,4);
        if (UVar15 <= uVar23) goto LAB_00466d31;
        iVar33 = 1 << ((byte)uVar7 & 0x1f);
        local_140 = 999999999;
        pBVar27 = (BYTE *)0x3;
        do {
          if (UVar15 < uVar14) {
            if (*(int *)(pBVar20 + UVar15) == (int)*puVar28) {
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar28 + 4),pBVar20 + (ulong)UVar15 + 4,
                                  (BYTE *)iEnd,pBVar20 + uVar14,pBVar25 + uVar14);
              pBVar18 = (BYTE *)(sVar17 + 4);
            }
            else {
LAB_00466c8b:
              pBVar18 = (BYTE *)0x0;
            }
          }
          else {
            puVar30 = (ulong *)(pBVar25 + UVar15);
            if (pBVar27[(long)puVar30] != *(BYTE *)((long)puVar28 + (long)pBVar27))
            goto LAB_00466c8b;
            puVar31 = puVar28;
            if (puVar28 < puVar1) {
              uVar19 = *puVar28 ^ *puVar30;
              uVar21 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              pBVar18 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
              if (*puVar30 == *puVar28) {
                do {
                  puVar31 = puVar31 + 1;
                  puVar30 = puVar30 + 1;
                  if (puVar1 <= puVar31) goto LAB_00466c92;
                  uVar19 = *puVar31 ^ *puVar30;
                  uVar21 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  pBVar18 = (BYTE *)((long)puVar31 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar28));
                } while (*puVar30 == *puVar31);
              }
            }
            else {
LAB_00466c92:
              if ((puVar31 < puVar2) && ((int)*puVar30 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar31 < puVar3) && ((short)*puVar30 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar31 < iEnd) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar31));
              }
              pBVar18 = (BYTE *)((long)puVar31 - (long)puVar28);
            }
          }
          if ((pBVar27 < pBVar18) &&
             (local_140 = (ulong)((uVar29 + 2) - UVar15), pBVar27 = pBVar18,
             (ulong *)((long)puVar28 + (long)pBVar18) == iEnd)) {
            bVar12 = false;
          }
          else {
            pBVar18 = pBVar27;
            if (uVar22 < UVar15) {
              UVar15 = pUVar10[UVar15 & uVar34 - 1];
              bVar12 = true;
            }
            else {
              bVar12 = false;
            }
          }
        } while (((bVar12) && (uVar23 < UVar15)) &&
                (iVar33 = iVar33 + -1, pBVar27 = pBVar18, iVar33 != 0));
      }
      local_130 = local_e0;
      if (local_e0 < pBVar18) {
        local_130 = pBVar18;
      }
      if (local_130 < (BYTE *)0x4) {
        puVar28 = (ulong *)((long)puVar28 + ((long)puVar28 - (long)local_d0 >> 8) + 1);
      }
      else {
        local_c0 = puVar28;
        if (pBVar18 <= local_e0) {
          local_140 = 0;
          local_c0 = (ulong *)((long)puVar28 + 1);
        }
        do {
          if (puVar4 <= puVar28) break;
          puVar30 = (ulong *)((long)puVar28 + 1);
          local_94 = local_94 + 1;
          if (local_140 == 0) {
            local_140 = 0;
          }
          else {
            uVar14 = local_94 - local_144;
            pBVar25 = pBVar8;
            if (uVar14 < uVar5) {
              pBVar25 = pBVar9;
            }
            if ((uVar6 < uVar14 && 2 < iVar13 - uVar14) &&
               (*(int *)puVar30 == *(int *)(pBVar25 + uVar14))) {
              puVar31 = iEnd;
              if (uVar14 < uVar5) {
                puVar31 = puVar16;
              }
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar28 + 5),(BYTE *)((long)(pBVar25 + uVar14) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar31,iStart);
              if (sVar17 < 0xfffffffffffffffc) {
                uVar23 = (int)local_140 + 1;
                uVar14 = 0x1f;
                if (uVar23 != 0) {
                  for (; uVar23 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                  }
                }
                if ((int)((uVar14 ^ 0x1f) + (int)local_130 * 3 + -0x1e) <
                    (int)(BYTE *)(sVar17 + 4) * 3) {
                  local_140 = 0;
                  local_130 = (BYTE *)(sVar17 + 4);
                  local_c0 = puVar30;
                }
              }
            }
          }
          uVar14 = (ms->cParams).minMatch;
          iVar33 = (int)puVar30;
          if (uVar14 - 6 < 2) {
            uVar29 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pUVar10 = ms->chainTable;
            pBVar25 = (ms->window).base;
            pBVar20 = (ms->window).dictBase;
            uVar14 = (ms->window).dictLimit;
            uVar23 = (ms->window).lowLimit;
            uVar34 = iVar33 - (int)pBVar25;
            uVar22 = uVar34 - uVar29;
            if (uVar34 < uVar29) {
              uVar22 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,6);
            if (uVar23 < UVar15) {
              iVar33 = 1 << ((byte)uVar7 & 0x1f);
              local_158 = 999999999;
              pBVar27 = (BYTE *)0x3;
              do {
                if (UVar15 < uVar14) {
                  if (*(int *)(pBVar20 + UVar15) == *(int *)puVar30) {
                    sVar17 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar28 + 5),pBVar20 + (ulong)UVar15 + 4,
                                        (BYTE *)iEnd,pBVar20 + uVar14,pBVar25 + uVar14);
                    pBVar18 = (BYTE *)(sVar17 + 4);
                  }
                  else {
LAB_00467093:
                    pBVar18 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar31 = (ulong *)(pBVar25 + UVar15);
                  if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar30 + (long)pBVar27))
                  goto LAB_00467093;
                  puVar24 = puVar30;
                  if (puVar30 < puVar1) {
                    uVar19 = *puVar30 ^ *puVar31;
                    uVar21 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar18 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                    puVar24 = (ulong *)((long)puVar28 + 9);
                    if (*puVar31 == *puVar30) {
                      do {
                        puVar31 = puVar31 + 1;
                        if (puVar1 <= puVar24) goto LAB_0046709a;
                        uVar21 = *puVar24;
                        uVar32 = uVar21 ^ *puVar31;
                        uVar19 = 0;
                        if (uVar32 != 0) {
                          for (; (uVar32 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        pBVar18 = (BYTE *)((long)puVar24 +
                                          ((uVar19 >> 3 & 0x1fffffff) - (long)puVar30));
                        puVar24 = puVar24 + 1;
                      } while (*puVar31 == uVar21);
                    }
                  }
                  else {
LAB_0046709a:
                    if ((puVar24 < puVar2) && ((int)*puVar31 == (int)*puVar24)) {
                      puVar24 = (ulong *)((long)puVar24 + 4);
                      puVar31 = (ulong *)((long)puVar31 + 4);
                    }
                    if ((puVar24 < puVar3) && ((short)*puVar31 == (short)*puVar24)) {
                      puVar24 = (ulong *)((long)puVar24 + 2);
                      puVar31 = (ulong *)((long)puVar31 + 2);
                    }
                    if (puVar24 < iEnd) {
                      puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar24))
                      ;
                    }
                    pBVar18 = (BYTE *)((long)puVar24 - (long)puVar30);
                  }
                }
                if ((pBVar27 < pBVar18) &&
                   (local_158 = (ulong)((uVar34 + 2) - UVar15), pBVar27 = pBVar18,
                   (ulong *)((long)puVar30 + (long)pBVar18) == iEnd)) {
                  bVar12 = false;
                }
                else {
                  pBVar18 = pBVar27;
                  if (uVar22 < UVar15) {
                    UVar15 = pUVar10[UVar15 & uVar29 - 1];
                    bVar12 = true;
                  }
                  else {
                    bVar12 = false;
                  }
                }
              } while (((bVar12) && (uVar23 < UVar15)) &&
                      (iVar33 = iVar33 + -1, pBVar27 = pBVar18, iVar33 != 0));
            }
            else {
              pBVar18 = (BYTE *)0x3;
              local_158 = 999999999;
            }
          }
          else if (uVar14 == 5) {
            uVar34 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pUVar10 = ms->chainTable;
            pBVar25 = (ms->window).base;
            pBVar20 = (ms->window).dictBase;
            uVar14 = (ms->window).dictLimit;
            uVar23 = (ms->window).lowLimit;
            uVar29 = iVar33 - (int)pBVar25;
            uVar22 = uVar29 - uVar34;
            if (uVar29 < uVar34) {
              uVar22 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,5);
            if (uVar23 < UVar15) {
              iVar33 = 1 << ((byte)uVar7 & 0x1f);
              local_158 = 999999999;
              pBVar27 = (BYTE *)0x3;
              do {
                if (UVar15 < uVar14) {
                  if (*(int *)(pBVar20 + UVar15) == *(int *)puVar30) {
                    sVar17 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar28 + 5),pBVar20 + (ulong)UVar15 + 4,
                                        (BYTE *)iEnd,pBVar20 + uVar14,pBVar25 + uVar14);
                    pBVar18 = (BYTE *)(sVar17 + 4);
                  }
                  else {
LAB_00467306:
                    pBVar18 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar31 = (ulong *)(pBVar25 + UVar15);
                  if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar30 + (long)pBVar27))
                  goto LAB_00467306;
                  puVar24 = puVar30;
                  if (puVar30 < puVar1) {
                    uVar19 = *puVar30 ^ *puVar31;
                    uVar21 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    pBVar18 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                    puVar24 = (ulong *)((long)puVar28 + 9);
                    if (*puVar31 == *puVar30) {
                      do {
                        puVar31 = puVar31 + 1;
                        if (puVar1 <= puVar24) goto LAB_0046730d;
                        uVar21 = *puVar24;
                        uVar32 = uVar21 ^ *puVar31;
                        uVar19 = 0;
                        if (uVar32 != 0) {
                          for (; (uVar32 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        pBVar18 = (BYTE *)((long)puVar24 +
                                          ((uVar19 >> 3 & 0x1fffffff) - (long)puVar30));
                        puVar24 = puVar24 + 1;
                      } while (*puVar31 == uVar21);
                    }
                  }
                  else {
LAB_0046730d:
                    if ((puVar24 < puVar2) && ((int)*puVar31 == (int)*puVar24)) {
                      puVar24 = (ulong *)((long)puVar24 + 4);
                      puVar31 = (ulong *)((long)puVar31 + 4);
                    }
                    if ((puVar24 < puVar3) && ((short)*puVar31 == (short)*puVar24)) {
                      puVar24 = (ulong *)((long)puVar24 + 2);
                      puVar31 = (ulong *)((long)puVar31 + 2);
                    }
                    if (puVar24 < iEnd) {
                      puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar24))
                      ;
                    }
                    pBVar18 = (BYTE *)((long)puVar24 - (long)puVar30);
                  }
                }
                if ((pBVar27 < pBVar18) &&
                   (local_158 = (ulong)((uVar29 + 2) - UVar15), pBVar27 = pBVar18,
                   (ulong *)((long)puVar30 + (long)pBVar18) == iEnd)) {
                  bVar12 = false;
                }
                else {
                  pBVar18 = pBVar27;
                  if (uVar22 < UVar15) {
                    UVar15 = pUVar10[UVar15 & uVar34 - 1];
                    bVar12 = true;
                  }
                  else {
                    bVar12 = false;
                  }
                }
              } while (((bVar12) && (uVar23 < UVar15)) &&
                      (iVar33 = iVar33 + -1, pBVar27 = pBVar18, iVar33 != 0));
            }
            else {
LAB_0046761c:
              pBVar18 = (BYTE *)0x3;
              local_158 = 999999999;
            }
          }
          else {
            uVar34 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pUVar10 = ms->chainTable;
            pBVar25 = (ms->window).base;
            pBVar20 = (ms->window).dictBase;
            uVar14 = (ms->window).dictLimit;
            uVar23 = (ms->window).lowLimit;
            uVar29 = iVar33 - (int)pBVar25;
            uVar22 = uVar29 - uVar34;
            if (uVar29 < uVar34) {
              uVar22 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            UVar15 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar30,4);
            if (UVar15 <= uVar23) goto LAB_0046761c;
            iVar33 = 1 << ((byte)uVar7 & 0x1f);
            local_158 = 999999999;
            pBVar27 = (BYTE *)0x3;
            do {
              if (UVar15 < uVar14) {
                if (*(int *)(pBVar20 + UVar15) == *(int *)puVar30) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar28 + 5),pBVar20 + (ulong)UVar15 + 4,
                                      (BYTE *)iEnd,pBVar20 + uVar14,pBVar25 + uVar14);
                  pBVar18 = (BYTE *)(sVar17 + 4);
                }
                else {
LAB_0046757a:
                  pBVar18 = (BYTE *)0x0;
                }
              }
              else {
                puVar31 = (ulong *)(pBVar25 + UVar15);
                if (pBVar27[(long)puVar31] != *(BYTE *)((long)puVar30 + (long)pBVar27))
                goto LAB_0046757a;
                puVar24 = puVar30;
                if (puVar30 < puVar1) {
                  uVar19 = *puVar30 ^ *puVar31;
                  uVar21 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  pBVar18 = (BYTE *)(uVar21 >> 3 & 0x1fffffff);
                  puVar24 = (ulong *)((long)puVar28 + 9);
                  if (*puVar31 == *puVar30) {
                    do {
                      puVar31 = puVar31 + 1;
                      if (puVar1 <= puVar24) goto LAB_00467581;
                      uVar21 = *puVar24;
                      uVar32 = uVar21 ^ *puVar31;
                      uVar19 = 0;
                      if (uVar32 != 0) {
                        for (; (uVar32 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                        }
                      }
                      pBVar18 = (BYTE *)((long)puVar24 +
                                        ((uVar19 >> 3 & 0x1fffffff) - (long)puVar30));
                      puVar24 = puVar24 + 1;
                    } while (*puVar31 == uVar21);
                  }
                }
                else {
LAB_00467581:
                  if ((puVar24 < puVar2) && ((int)*puVar31 == (int)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar24 < puVar3) && ((short)*puVar31 == (short)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar24 < iEnd) {
                    puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar24));
                  }
                  pBVar18 = (BYTE *)((long)puVar24 - (long)puVar30);
                }
              }
              if ((pBVar27 < pBVar18) &&
                 (local_158 = (ulong)((uVar29 + 2) - UVar15), pBVar27 = pBVar18,
                 (ulong *)((long)puVar30 + (long)pBVar18) == iEnd)) {
                bVar12 = false;
              }
              else {
                pBVar18 = pBVar27;
                if (uVar22 < UVar15) {
                  UVar15 = pUVar10[UVar15 & uVar34 - 1];
                  bVar12 = true;
                }
                else {
                  bVar12 = false;
                }
              }
            } while (((bVar12) && (uVar23 < UVar15)) &&
                    (iVar33 = iVar33 + -1, pBVar27 = pBVar18, iVar33 != 0));
          }
          bVar12 = true;
          if ((BYTE *)0x3 < pBVar18) {
            uVar23 = (int)local_140 + 1;
            uVar14 = 0x1f;
            if (uVar23 != 0) {
              for (; uVar23 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            uVar23 = (int)local_158 + 1;
            iVar33 = 0x1f;
            if (uVar23 != 0) {
              for (; uVar23 >> iVar33 == 0; iVar33 = iVar33 + -1) {
              }
            }
            if ((int)((uVar14 ^ 0x1f) + (int)local_130 * 4 + -0x1b) < (int)pBVar18 * 4 - iVar33) {
              bVar12 = false;
              local_140 = local_158;
              local_130 = pBVar18;
              local_c0 = puVar30;
            }
          }
          puVar28 = puVar30;
        } while (!bVar12);
        if (local_140 == 0) {
          UVar15 = 1;
        }
        else {
          pBVar27 = (BYTE *)((long)local_c0 + (2 - (long)(pBVar8 + local_140)));
          pBVar20 = iStart;
          pBVar25 = pBVar8;
          if ((uint)pBVar27 < uVar5) {
            pBVar20 = pBVar9 + uVar6;
            pBVar25 = pBVar9;
          }
          if ((local_d0 < local_c0) &&
             (uVar21 = (ulong)pBVar27 & 0xffffffff, pBVar20 < pBVar25 + uVar21)) {
            pBVar25 = pBVar25 + uVar21;
            do {
              puVar28 = (ulong *)((long)local_c0 + -1);
              pBVar25 = pBVar25 + -1;
              if ((*(BYTE *)puVar28 != *pBVar25) ||
                 (local_130 = local_130 + 1, local_c0 = puVar28, puVar28 <= local_d0)) break;
            } while (pBVar20 < pBVar25);
          }
          UVar15 = (int)local_140 + 1;
          UVar26 = local_144;
          local_144 = (int)local_140 - 2;
        }
        uVar21 = (long)local_c0 - (long)local_d0;
        puVar30 = (ulong *)seqStore->lit;
        puVar28 = (ulong *)((long)puVar30 + uVar21);
        do {
          *puVar30 = *local_d0;
          puVar30 = puVar30 + 1;
          local_d0 = local_d0 + 1;
        } while (puVar30 < puVar28);
        seqStore->lit = seqStore->lit + uVar21;
        if (0xffff < uVar21) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar11 = seqStore->sequences;
        psVar11->litLength = (U16)uVar21;
        psVar11->offset = UVar15;
        if ((BYTE *)0xffff < local_130 + -3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar11->matchLength = (U16)(local_130 + -3);
        seqStore->sequences = psVar11 + 1;
        puVar28 = (ulong *)((long)local_c0 + (long)local_130);
        local_d0 = puVar28;
        do {
          if (puVar4 < puVar28) break;
          uVar14 = (uint)((long)puVar28 - (long)(pBVar8 + UVar26));
          pBVar25 = pBVar8;
          if (uVar14 < uVar5) {
            pBVar25 = pBVar9;
          }
          if ((uVar6 < uVar14 && 2 < iVar13 - uVar14) &&
             ((int)*puVar28 ==
              *(int *)(pBVar25 + ((long)puVar28 - (long)(pBVar8 + UVar26) & 0xffffffff)))) {
            puVar30 = iEnd;
            if (uVar14 < uVar5) {
              puVar30 = puVar16;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar28 + 4),
                                (BYTE *)((long)(pBVar25 +
                                               ((long)puVar28 - (long)(pBVar8 + UVar26) & 0xffffffff
                                               )) + 4),(BYTE *)iEnd,(BYTE *)puVar30,iStart);
            *(ulong *)seqStore->lit = *local_d0;
            psVar11 = seqStore->sequences;
            psVar11->litLength = 0;
            psVar11->offset = 1;
            if (0xffff < sVar17 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar11 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar11->matchLength = (U16)(sVar17 + 1);
            seqStore->sequences = psVar11 + 1;
            puVar28 = (ulong *)((long)puVar28 + sVar17 + 4);
            bVar12 = true;
            UVar15 = local_144;
            local_144 = UVar26;
            local_d0 = puVar28;
          }
          else {
            bVar12 = false;
            UVar15 = UVar26;
          }
          UVar26 = UVar15;
        } while (bVar12);
      }
    } while (puVar28 < puVar4);
  }
  *rep = local_144;
  rep[1] = UVar26;
  return (long)iEnd - (long)local_d0;
}

Assistant:

FORCE_INLINE_TEMPLATE
size_t ZSTD_compressBlock_lazy_extDict_generic(
                        ZSTD_matchState_t* ms, seqStore_t* seqStore,
                        U32 rep[ZSTD_REP_NUM],
                        const void* src, size_t srcSize,
                        const U32 searchMethod, const U32 depth)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32 dictLimit = ms->window.dictLimit;
    const U32 lowestIndex = ms->window.lowLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictEnd  = dictBase + dictLimit;
    const BYTE* const dictStart  = dictBase + lowestIndex;

    typedef size_t (*searchMax_f)(
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* iLimit, size_t* offsetPtr);
    searchMax_f searchMax = searchMethod ? ZSTD_BtFindBestMatch_extDict_selectMLS : ZSTD_HcFindBestMatch_extDict_selectMLS;

    U32 offset_1 = rep[0], offset_2 = rep[1];

    /* init */
    ms->nextToUpdate3 = ms->nextToUpdate;
    ip += (ip == prefixStart);

    /* Match Loop */
    while (ip < ilimit) {
        size_t matchLength=0;
        size_t offset=0;
        const BYTE* start=ip+1;
        U32 current = (U32)(ip-base);

        /* check repCode */
        {   const U32 repIndex = (U32)(current+1 - offset_1);
            const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
            const BYTE* const repMatch = repBase + repIndex;
            if (((U32)((dictLimit-1) - repIndex) >= 3) & (repIndex > lowestIndex))   /* intentional overflow */
            if (MEM_read32(ip+1) == MEM_read32(repMatch)) {
                /* repcode detected we should take it */
                const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                if (depth==0) goto _storeSequence;
        }   }

        /* first search (depth 0) */
        {   size_t offsetFound = 999999999;
            size_t const ml2 = searchMax(ms, ip, iend, &offsetFound);
            if (ml2 > matchLength)
                matchLength = ml2, start = ip, offset=offsetFound;
        }

         if (matchLength < 4) {
            ip += ((ip-anchor) >> kSearchStrength) + 1;   /* jump faster over incompressible sections */
            continue;
        }

        /* let's try to find a better solution */
        if (depth>=1)
        while (ip<ilimit) {
            ip ++;
            current++;
            /* check repCode */
            if (offset) {
                const U32 repIndex = (U32)(current - offset_1);
                const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
                const BYTE* const repMatch = repBase + repIndex;
                if (((U32)((dictLimit-1) - repIndex) >= 3) & (repIndex > lowestIndex))  /* intentional overflow */
                if (MEM_read32(ip) == MEM_read32(repMatch)) {
                    /* repcode detected */
                    const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                    size_t const repLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                    int const gain2 = (int)(repLength * 3);
                    int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offset+1) + 1);
                    if ((repLength >= 4) && (gain2 > gain1))
                        matchLength = repLength, offset = 0, start = ip;
            }   }

            /* search match, depth 1 */
            {   size_t offset2=999999999;
                size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 4);
                if ((ml2 >= 4) && (gain2 > gain1)) {
                    matchLength = ml2, offset = offset2, start = ip;
                    continue;   /* search a better one */
            }   }

            /* let's find an even better one */
            if ((depth==2) && (ip<ilimit)) {
                ip ++;
                current++;
                /* check repCode */
                if (offset) {
                    const U32 repIndex = (U32)(current - offset_1);
                    const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
                    const BYTE* const repMatch = repBase + repIndex;
                    if (((U32)((dictLimit-1) - repIndex) >= 3) & (repIndex > lowestIndex))  /* intentional overflow */
                    if (MEM_read32(ip) == MEM_read32(repMatch)) {
                        /* repcode detected */
                        const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                        size_t const repLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                        int const gain2 = (int)(repLength * 4);
                        int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 1);
                        if ((repLength >= 4) && (gain2 > gain1))
                            matchLength = repLength, offset = 0, start = ip;
                }   }

                /* search match, depth 2 */
                {   size_t offset2=999999999;
                    size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                    int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 7);
                    if ((ml2 >= 4) && (gain2 > gain1)) {
                        matchLength = ml2, offset = offset2, start = ip;
                        continue;
            }   }   }
            break;  /* nothing found : store previous solution */
        }

        /* catch up */
        if (offset) {
            U32 const matchIndex = (U32)((start-base) - (offset - ZSTD_REP_MOVE));
            const BYTE* match = (matchIndex < dictLimit) ? dictBase + matchIndex : base + matchIndex;
            const BYTE* const mStart = (matchIndex < dictLimit) ? dictStart : prefixStart;
            while ((start>anchor) && (match>mStart) && (start[-1] == match[-1])) { start--; match--; matchLength++; }  /* catch up */
            offset_2 = offset_1; offset_1 = (U32)(offset - ZSTD_REP_MOVE);
        }

        /* store sequence */
_storeSequence:
        {   size_t const litLength = start - anchor;
            ZSTD_storeSeq(seqStore, litLength, anchor, (U32)offset, matchLength-MINMATCH);
            anchor = ip = start + matchLength;
        }

        /* check immediate repcode */
        while (ip <= ilimit) {
            const U32 repIndex = (U32)((ip-base) - offset_2);
            const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
            const BYTE* const repMatch = repBase + repIndex;
            if (((U32)((dictLimit-1) - repIndex) >= 3) & (repIndex > lowestIndex))  /* intentional overflow */
            if (MEM_read32(ip) == MEM_read32(repMatch)) {
                /* repcode detected we should take it */
                const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                offset = offset_2; offset_2 = offset_1; offset_1 = (U32)offset;   /* swap offset history */
                ZSTD_storeSeq(seqStore, 0, anchor, 0, matchLength-MINMATCH);
                ip += matchLength;
                anchor = ip;
                continue;   /* faster when present ... (?) */
            }
            break;
    }   }

    /* Save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}